

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.h
# Opt level: O2

void __thiscall
Js::JavascriptPromiseResolveThenableTaskFunction::JavascriptPromiseResolveThenableTaskFunction
          (JavascriptPromiseResolveThenableTaskFunction *this,DynamicType *type,
          FunctionInfo *functionInfo,JavascriptPromise *promise,RecyclableObject *thenable,
          RecyclableObject *thenFunction)

{
  RuntimeFunction::RuntimeFunction(&this->super_RuntimeFunction,type,functionInfo);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_013cb710;
  Memory::WriteBarrierPtr<Js::JavascriptPromise>::WriteBarrierSet(&this->promise,promise);
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierSet(&this->thenable,thenable);
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierSet(&this->thenFunction,thenFunction);
  return;
}

Assistant:

JavascriptPromiseResolveThenableTaskFunction(DynamicType* type, FunctionInfo* functionInfo, JavascriptPromise* promise, RecyclableObject* thenable, RecyclableObject* thenFunction)
            : RuntimeFunction(type, functionInfo), promise(promise), thenable(thenable), thenFunction(thenFunction)
        { }